

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O0

int si9ma::DP::save_money_recursive(int *arr,int length,int index,int target)

{
  int iVar1;
  int local_2c;
  uint local_28;
  int i;
  int res;
  int target_local;
  int index_local;
  int length_local;
  int *arr_local;
  
  if ((arr == (int *)0x0) || (target < 0)) {
    arr_local._4_4_ = 0;
  }
  else if (index == length) {
    arr_local._4_4_ = (uint)(target == 0);
  }
  else if (target == 0) {
    arr_local._4_4_ = 1;
  }
  else {
    local_28 = 0;
    for (local_2c = 0; local_2c * arr[index] <= target; local_2c = local_2c + 1) {
      iVar1 = save_money_recursive(arr,length,index + 1,target - local_2c * arr[index]);
      local_28 = iVar1 + local_28;
    }
    arr_local._4_4_ = local_28;
  }
  return arr_local._4_4_;
}

Assistant:

int DP::save_money_recursive(int *arr,int length,int index,int target) {
        if (arr == nullptr || target < 0)
            return 0;

        if (index == length)
            return target == 0;

        if (target == 0)
            return 1;

        int res = 0;
        for (int i = 0; i * arr[index] <= target; ++i) {
            res += save_money_recursive(arr,length,index + 1,target - i*arr[index]);
        }

        return res;
    }